

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void __thiscall ExampleAppConsole::~ExampleAppConsole(ExampleAppConsole *this)

{
  ImVector<char_*> *this_00;
  char **ppcVar1;
  int i;
  int i_00;
  
  ClearLog(this);
  this_00 = &this->History;
  for (i_00 = 0; i_00 < this_00->Size; i_00 = i_00 + 1) {
    ppcVar1 = ImVector<char_*>::operator[](this_00,i_00);
    free(*ppcVar1);
  }
  ImVector<ImGuiTextFilter::ImGuiTextRange>::~ImVector(&(this->Filter).Filters);
  ImVector<char_*>::~ImVector(this_00);
  ImVector<const_char_*>::~ImVector(&this->Commands);
  ImVector<char_*>::~ImVector(&this->Items);
  return;
}

Assistant:

~ExampleAppConsole()
    {
        ClearLog();
        for (int i = 0; i < History.Size; i++)
            free(History[i]);
    }